

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::CheckNameSpace
          (LobsterGenerator *this,Definition *def,string *code_ptr)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string *local_60;
  string *code;
  uint local_44;
  undefined1 local_40 [8];
  string ns;
  string *code_ptr_local;
  Definition *def_local;
  LobsterGenerator *this_local;
  
  ns.field_2._8_8_ = code_ptr;
  BaseGenerator::GetNameSpace_abi_cxx11_((string *)local_40,&this->super_BaseGenerator,def);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,&this->current_namespace_);
  if (!_Var1) {
    std::__cxx11::string::operator=((string *)&this->current_namespace_,(string *)local_40);
    local_60 = (string *)ns.field_2._8_8_;
    std::operator+(&local_a0,"namespace ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_80,&local_a0,"\n\n");
    std::__cxx11::string::operator+=(local_60,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  local_44 = (uint)_Var1;
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CheckNameSpace(const Definition &def, std::string *code_ptr) {
    auto ns = GetNameSpace(def);
    if (ns == current_namespace_) return;
    current_namespace_ = ns;
    std::string &code = *code_ptr;
    code += "namespace " + ns + "\n\n";
  }